

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::MergeWireAssignmentsVisitor::get_stmts_to_remove<kratos::Generator>
          (MergeWireAssignmentsVisitor *this,Generator *generator,
          set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          *stmts_to_remove,
          set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *sliced_stmts)

{
  value_type vVar1;
  size_t this_00;
  bool bVar2;
  VarType VVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  element_type *peVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  size_type sVar10;
  reference pvVar11;
  vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
  *this_01;
  reference __in;
  type *__in_00;
  type *this_02;
  type *ppVVar12;
  type *ppVVar13;
  size_type sVar14;
  reference __args;
  shared_ptr<kratos::AssignStmt> *stmt;
  const_iterator __end3;
  const_iterator __begin3;
  type *__range3;
  type *right;
  type *left;
  type *stmts;
  type *vars;
  _Self local_e8;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
  *__range2_1;
  undefined4 local_bc;
  Var *local_b8;
  Var *right_parent;
  Var *left_parent;
  shared_ptr<kratos::VarSlice> right_slice;
  undefined1 local_88 [8];
  shared_ptr<kratos::VarSlice> left_slice;
  shared_ptr<kratos::AssignStmt> *assign_stmt;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
  slice_vars;
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sliced_stmts_local;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *stmts_to_remove_local;
  Generator *generator_local;
  MergeWireAssignmentsVisitor *this_local;
  
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)sliced_stmts;
  std::
  map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
  ::map((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
         *)&__range2);
  this_00 = slice_vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = std::
           set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)slice_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  assign_stmt = (shared_ptr<kratos::AssignStmt> *)
                std::
                set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                ::end((set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                       *)this_00);
  do {
    bVar2 = std::operator!=(&__end2,(_Self *)&assign_stmt);
    if (!bVar2) {
      __end2_1 = std::
                 map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                 ::begin((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                          *)&__range2);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
           ::end((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                  *)&__range2);
      while (bVar2 = std::operator!=(&__end2_1,&local_e8), bVar2) {
        __in = std::
               _Rb_tree_iterator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>
               ::operator*(&__end2_1);
        __in_00 = std::
                  get<0ul,std::pair<kratos::Var*,kratos::Var*>const,std::vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>>
                            (__in);
        this_02 = std::
                  get<1ul,std::pair<kratos::Var*,kratos::Var*>const,std::vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>>
                            (__in);
        ppVVar12 = std::get<0ul,kratos::Var*,kratos::Var*>(__in_00);
        ppVVar13 = std::get<1ul,kratos::Var*,kratos::Var*>(__in_00);
        sVar14 = std::
                 vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::size(this_02);
        uVar6 = (*((*ppVVar12)->super_IRNode)._vptr_IRNode[7])();
        if (sVar14 == uVar6) {
          __end3 = std::
                   vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin(this_02);
          stmt = (shared_ptr<kratos::AssignStmt> *)
                 std::
                 vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::end(this_02);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                                             *)&stmt), bVar2) {
            __args = __gnu_cxx::
                     __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                     ::operator*(&__end3);
            (*((*ppVVar12)->super_IRNode)._vptr_IRNode[0x13])(*ppVVar12,__args);
            (*((*ppVVar13)->super_IRNode)._vptr_IRNode[0xf])(*ppVVar13,__args);
            std::
            set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
            ::emplace<std::shared_ptr<kratos::AssignStmt>const&>
                      ((set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                        *)stmts_to_remove,__args);
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
            ::operator++(&__end3);
          }
          create_new_assignment(generator,this_02,*ppVVar12,*ppVVar13);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::
      map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
      ::~map((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
              *)&__range2);
      return;
    }
    left_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Rb_tree_const_iterator<std::shared_ptr<kratos::AssignStmt>_>::operator*(&__end2);
    peVar7 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)left_slice.
                             super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    AssignStmt::left(peVar7);
    Var::as<kratos::VarSlice>((Var *)local_88);
    peVar7 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)left_slice.
                             super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    AssignStmt::right(peVar7);
    Var::as<kratos::VarSlice>((Var *)&left_parent);
    peVar8 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    right_parent = peVar8->parent_var;
    peVar8 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&left_parent);
    local_b8 = peVar8->parent_var;
    VVar3 = Var::type(right_parent);
    if (VVar3 == Slice) {
      local_bc = 3;
    }
    else {
      VVar3 = Var::type(local_b8);
      if (VVar3 == Slice) {
        local_bc = 3;
      }
      else {
        iVar4 = (*(right_parent->super_IRNode)._vptr_IRNode[7])();
        iVar5 = (*(local_b8->super_IRNode)._vptr_IRNode[7])();
        if (iVar4 == iVar5) {
          pvVar9 = Var::size(right_parent);
          sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
          pvVar9 = Var::size(local_b8);
          sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
          if (sVar14 == sVar10) {
            pvVar9 = Var::size(right_parent);
            pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar9);
            vVar1 = *pvVar11;
            pvVar9 = Var::size(local_b8);
            pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar9);
            if (vVar1 == *pvVar11) {
              std::pair<kratos::Var_*,_kratos::Var_*>::pair<kratos::Var_*&,_kratos::Var_*&,_true>
                        ((pair<kratos::Var_*,_kratos::Var_*> *)&__range2_1,&right_parent,&local_b8);
              this_01 = (vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                         *)std::
                           map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                           ::operator[]((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                                         *)&__range2,(key_type *)&__range2_1);
              std::
              vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
              ::emplace_back<std::shared_ptr<kratos::AssignStmt>const&>
                        (this_01,(shared_ptr<kratos::AssignStmt> *)
                                 left_slice.
                                 super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
              local_bc = 0;
              goto LAB_003bc023;
            }
          }
          local_bc = 3;
        }
        else {
          local_bc = 3;
        }
      }
    }
LAB_003bc023:
    std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)&left_parent);
    std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)local_88);
    std::_Rb_tree_const_iterator<std::shared_ptr<kratos::AssignStmt>_>::operator++(&__end2);
  } while( true );
}

Assistant:

void get_stmts_to_remove(T* generator, std::set<std::shared_ptr<Stmt>>& stmts_to_remove,
                             const std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) const {
        // group the assignments together
        using AssignPair = std::pair<Var*, Var*>;
        std::map<AssignPair, std::vector<std::shared_ptr<AssignStmt>>> slice_vars;
        for (auto const& assign_stmt : sliced_stmts) {
            auto left_slice = assign_stmt->left()->as<VarSlice>();
            auto right_slice = assign_stmt->right()->as<VarSlice>();
            Var* left_parent = left_slice->parent_var;
            Var* right_parent = right_slice->parent_var;
            // only deal with 1D for now
            if (left_parent->type() == VarType::Slice) continue;
            if (right_parent->type() == VarType::Slice) continue;
            if (left_parent->width() != right_parent->width()) continue;
            if (left_parent->size().size() != right_parent->size().size() ||
                left_parent->size().front() != right_parent->size().front())
                continue;

            slice_vars[{left_parent, right_parent}].emplace_back(assign_stmt);
        }

        // merge the assignments
        for (auto const& [vars, stmts] : slice_vars) {
            const auto& [left, right] = vars;

            // NOTE:
            // we assume that at this stage we've passed the connectivity check
            if (stmts.size() != left->width()) continue;

            // remove left's sources and right's sink
            // also add it to the statements to remove
            for (auto const& stmt : stmts) {
                left->remove_source(stmt);
                right->remove_sink(stmt);
                stmts_to_remove.emplace(stmt);
            }
            // make new assignment
            create_new_assignment(generator, stmts, left, right);
        }
    }